

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O1

int doread(obj *scroll)

{
  char cVar1;
  ushort uVar2;
  short sVar3;
  boolean bVar4;
  byte bVar5;
  uint uVar6;
  int iVar7;
  size_t sVar8;
  uint uVar9;
  char *pcVar10;
  char *pcVar11;
  boolean known;
  char tmp [256];
  boolean local_139;
  char local_138 [264];
  
  local_139 = '\0';
  bVar4 = check_capacity((char *)0x0);
  if (bVar4 != '\0') {
    return 0;
  }
  if (scroll == (obj *)0x0) {
    scroll = getobj("\f\x14\t\n","read",(obj **)0x0);
  }
  else {
    bVar4 = validate_object(scroll,"\f\x14\t\n","read");
    if (bVar4 == '\0') {
      return 0;
    }
  }
  if (scroll == (obj *)0x0) {
    return 0;
  }
  uVar2 = scroll->otyp;
  if (uVar2 < 0xf7) {
    if (uVar2 == 0x7b) {
      if (((u.uprops[0x1e].intrinsic != 0) ||
          (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
           (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
         ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) {
LAB_0022ab9e:
        pcVar10 = "You can\'t feel any Braille writing.";
        goto LAB_0022af16;
      }
      if (u.roleplay.illiterate == '\0') {
        violated(8);
        if (flags.verbose != '\0') {
          pline("It reads:");
        }
        strcpy(local_138,
               doread_shirt_msgs_rel +
               *(int *)(doread_shirt_msgs_rel + (ulong)(scroll->o_id % 0x43) * 4));
        uVar6 = *(uint *)&scroll->field_0x4a >> 8 & 3;
        uVar9 = *(uint *)&scroll->field_0x4a >> 10 & 3;
        if (uVar9 < uVar6) {
          uVar9 = uVar6;
        }
        if (uVar9 != 0) {
          sVar8 = strlen(local_138);
          wipeout_text(local_138,(int)((sVar8 * uVar9) / 6),scroll->o_id ^ (uint)u.ubirthday);
        }
        pline("\"%s\"",local_138);
        goto LAB_0022b2c1;
      }
LAB_0022af0f:
      pcVar10 = "Unfortunately, you cannot read.";
LAB_0022af16:
      pline(pcVar10);
      return 0;
    }
    if (uVar2 != 0xe4) {
      if (uVar2 != 0xf5) goto LAB_0022ab1f;
      goto LAB_0022aaa8;
    }
    if (u.roleplay.illiterate != '\0') {
      if ((((u.uprops[0x1e].intrinsic != 0) || ((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed))))
          || (((youmonst.data)->mflags1 & 0x1000) != 0)) &&
         ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) {
        pcVar10 = "You feel embossed writing.";
        goto LAB_0022abec;
      }
      if (flags.verbose != '\0') goto LAB_0022aef6;
      goto LAB_0022af0f;
    }
    if (((u.uprops[0x1e].intrinsic == 0) &&
        (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
         (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
       ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
      if (flags.verbose != '\0') {
        pline("It reads:");
      }
      if (scroll->oartifact == '\0') {
        uVar9 = scroll->o_id;
        pcVar10 = doread_card_msgs_rel +
                  *(int *)(doread_card_msgs_rel +
                          (ulong)(uVar9 - (uVar9 / 0xd + (uVar9 / 0xd) * 0xc)) * 4);
      }
      else {
        pcVar10 = "Yendorian Express - Platinum Card";
      }
      pline("\"%s\"",pcVar10);
    }
    else {
      pline("You feel the embossed numbers:");
    }
    uVar9 = scroll->o_id;
    pline("\"%d0%d %d%d1 0%d%d0\"",(ulong)(uVar9 % 0x59 + 10),(ulong)(uVar9 & 3),
          (ulong)((uVar9 * 499) % 899999 + 100000),(ulong)(uVar9 % 10),
          (ulong)(uVar9 * -0x55555555 < 0x55555556),(uVar9 * 7) % 10);
LAB_0022b2b7:
    violated(8);
LAB_0022b2c1:
    iVar7 = 1;
  }
  else {
    if (uVar2 < 0x122) {
      if (uVar2 == 0xf7) {
        if ((((u.uprops[0x1e].intrinsic != 0) ||
             ((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)))) ||
            (((youmonst.data)->mflags1 & 0x1000) != 0)) &&
           ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) goto LAB_0022ab9e;
        if (u.roleplay.illiterate == '\0') {
          if (flags.verbose != '\0') {
            pline("It reads:");
          }
          pcVar10 = "\"Magic Marker(TM) Red Ink Marker Pen. Water Soluble.\"";
LAB_0022b2b0:
          pline(pcVar10);
          goto LAB_0022b2b7;
        }
        if (flags.verbose == '\0') goto LAB_0022af0f;
LAB_0022aef6:
        pcVar10 = xname(scroll);
LAB_0022aefe:
        pcVar11 = "There is writing on the %s.";
LAB_0022af05:
        pline(pcVar11,pcVar10);
        goto LAB_0022af0f;
      }
      if (uVar2 != 0x121) goto LAB_0022ab1f;
    }
    else if (uVar2 != 0x129) {
      if (uVar2 == 0x122) {
        if (flags.verbose != '\0') {
          pline("You break up the cookie and throw away the pieces.");
        }
        if (u.roleplay.illiterate == '\0') {
          iVar7 = bcsign(scroll);
          outrumor(iVar7,1);
          if (((u.uprops[0x1e].intrinsic == 0) &&
              (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
               (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
             ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
            violated(8);
          }
        }
        else {
          pline("The cookie had a scrap of paper inside.");
          pline("What a pity that you cannot read!");
        }
        useup(scroll);
      }
      else {
LAB_0022ab1f:
        cVar1 = scroll->oclass;
        if (cVar1 == '\f') {
          if (u.roleplay.illiterate != '\0') {
            if (((u.uprops[0x1e].intrinsic == 0) &&
                (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
                 (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
               ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
              if (flags.verbose != '\0') {
                pcVar10 = singular(scroll,xname);
                goto LAB_0022aefe;
              }
            }
            else {
              pcVar10 = "You feel the embossed words.";
LAB_0022abec:
              pline(pcVar10);
            }
            goto LAB_0022af0f;
          }
          if ((((u.uprops[0x1e].intrinsic == 0) &&
               ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
              (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
             ((pcVar10 = "You feel the embossed words:", ublindf != (obj *)0x0 &&
              (ublindf->oartifact == '\x1d')))) {
            if (flags.verbose != '\0') {
              pcVar10 = "You read:";
              goto LAB_0022b0ea;
            }
          }
          else {
LAB_0022b0ea:
            pline(pcVar10);
          }
          pcVar10 = currency(1);
          strcpy(local_138,pcVar10);
          pcVar10 = upstart(local_138);
          pline("\"1 %s. 857 GUE. In Frobs We Trust.\"",pcVar10);
          goto LAB_0022b2b7;
        }
        if (scroll->oartifact == '#') {
          if (u.roleplay.illiterate == '\0') {
            if (((u.uprops[0x1e].intrinsic == 0) &&
                (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
                 (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
               ((pcVar10 = "You feel the engraved signature:", ublindf != (obj *)0x0 &&
                (ublindf->oartifact == '\x1d')))) {
              pcVar10 = "It is signed:";
            }
            pline(pcVar10);
            pcVar10 = "\"Odin.\"";
            goto LAB_0022b2b0;
          }
          if ((((u.uprops[0x1e].intrinsic != 0) ||
               ((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)))) ||
              (((youmonst.data)->mflags1 & 0x1000) != 0)) &&
             ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) {
            pcVar10 = "You feel an engraved signature.";
            goto LAB_0022abec;
          }
          if (flags.verbose != '\0') {
            pcVar10 = xname(scroll);
            pcVar11 = "The %s is signed.";
            goto LAB_0022af05;
          }
          goto LAB_0022af0f;
        }
        if ((obj_descr[objects[(short)uVar2].oc_descr_idx].oc_descr == (char *)0x0) ||
           (iVar7 = strncmp(obj_descr[objects[(short)uVar2].oc_descr_idx].oc_descr,"runed",5),
           iVar7 != 0)) {
          if (1 < (byte)(cVar1 - 9U)) {
            pcVar10 = "That is a silly thing to read.";
            goto LAB_0022af16;
          }
          if ((uVar2 != 0x1bd) && (u.roleplay.illiterate != '\0')) goto LAB_0022af0f;
          if ((u.uprops[0x1e].intrinsic != 0) ||
             (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
              (((youmonst.data)->mflags1 & 0x1000) != 0)))) {
            if (ublindf == (obj *)0x0) {
              if (uVar2 == 0x1bd) goto LAB_0022b3d4;
            }
            else if ((uVar2 == 0x1bd) || (ublindf->oartifact == '\x1d')) goto LAB_0022b3b4;
            if (cVar1 == '\n') {
              pcVar10 = "mystic runes";
              bVar5 = 0;
            }
            else {
              pcVar10 = (char *)0x0;
              bVar5 = (scroll->field_0x4a & 0x20) >> 5;
              if (bVar5 == 0) {
                pcVar10 = "formula on the scroll";
              }
            }
            if (bVar5 == 0) {
              pline("Being blind, you cannot read the %s.",pcVar10);
              return 0;
            }
          }
LAB_0022b3b4:
          if ((1 < uVar2 - 0x1bc) && (uVar2 != 0x17c)) {
            violated(8);
          }
LAB_0022b3d4:
          uVar9 = u.uprops[0x1c].intrinsic;
          if (scroll->oclass == '\n') {
            iVar7 = study_book(scroll);
            return iVar7;
          }
          scroll->field_0x4c = scroll->field_0x4c | 0x80;
          if (scroll->otyp != 0x17c) {
            if (((u.uprops[0x1e].intrinsic == 0) &&
                (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
                 (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
               ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
              pline("As you read the scroll, it disappears.");
            }
            else {
              pcVar10 = "pronounce";
              if ((youmonst.data)->msound == '\0') {
                pcVar10 = "cogitate";
              }
              pline("As you %s the formula on it, the scroll disappears.",pcVar10);
            }
            if (uVar9 != 0) {
              if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
                 ((u.umonnum != u.umonster && (bVar4 = dmgtype(youmonst.data,0x24), bVar4 != '\0')))
                 ) {
                pcVar10 = "pronounce";
                if ((youmonst.data)->msound == '\0') {
                  pcVar10 = "understand";
                }
                pline("Being confused, you mis%s the magic words...",pcVar10);
              }
              else {
                pline("Being so trippy, you screw up...");
              }
            }
          }
          iVar7 = seffects(scroll,&local_139);
          if (iVar7 != 0) {
            return 1;
          }
          sVar3 = scroll->otyp;
          if ((objects[sVar3].field_0x10 & 1) == 0) {
            if (local_139 == '\0') {
              if (objects[sVar3].oc_uname == (char *)0x0) {
                docall(scroll);
              }
            }
            else {
              discover_object((int)sVar3,'\x01','\x01');
              more_experienced(0,0,10);
            }
          }
          if (scroll->otyp == 0x17c) {
            scroll->field_0x4c = scroll->field_0x4c & 0x7f;
            return 1;
          }
          useup(scroll);
          return 1;
        }
        if (uVar2 == 0x2a) {
          pcVar10 = "You can\'t decipher the arcane runes.";
          goto LAB_0022af16;
        }
        if ((urace.malenum != 0x111) && (urole.malenum != 0x159)) {
          pcVar10 = "You can\'t decipher the Elvish runes.";
          goto LAB_0022af16;
        }
        if (u.roleplay.illiterate != '\0') {
          if (((u.uprops[0x1e].intrinsic != 0) ||
              (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
               (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
             ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) {
            pcVar10 = "You feel engraved runes.";
            goto LAB_0022abec;
          }
          if (flags.verbose != '\0') {
            pcVar10 = xname(scroll);
            pcVar11 = "There are runes on the %s.";
            goto LAB_0022af05;
          }
          goto LAB_0022af0f;
        }
        violated(8);
        if ((objects[scroll->otyp].field_0x10 & 2) == 0) {
          if ((((u.uprops[0x1e].intrinsic == 0) &&
               ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
              (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
             ((pcVar10 = "You feel the engraved signature:", ublindf != (obj *)0x0 &&
              (ublindf->oartifact == '\x1d')))) {
            pcVar10 = "It is signed:";
          }
          pline(pcVar10);
          uVar9 = scroll->o_id;
          pline("\"%s%s%s\"",
                doread_elf_syllable1_rel +
                *(int *)(doread_elf_syllable1_rel + (ulong)(uVar9 % 0x22) * 4),
                doread_elf_syllable2_rel +
                *(int *)(doread_elf_syllable2_rel + (ulong)(uVar9 % 0x11) * 4),
                doread_elf_syllable3_rel +
                *(int *)(doread_elf_syllable3_rel +
                        (ulong)(uVar9 - ((uVar9 / 0x1a) * 0x19 + uVar9 / 0x1a)) * 4));
          goto LAB_0022b2c1;
        }
        if (((u.uprops[0x1e].intrinsic == 0) &&
            (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
             (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
           ((pcVar10 = "You feel the engraved runes:", ublindf != (obj *)0x0 &&
            (ublindf->oartifact == '\x1d')))) {
          if (flags.verbose != '\0') {
            pcVar10 = "The runes read:";
            goto LAB_0022b7ae;
          }
        }
        else {
LAB_0022b7ae:
          pline(pcVar10);
        }
        pline("\"Made in Elfheim.\"");
      }
      goto LAB_0022b2c1;
    }
LAB_0022aaa8:
    pcVar10 = singular(scroll,xname);
    pcVar11 = "label";
    if (scroll->otyp == 0x121) {
      pcVar11 = "wrapper";
    }
    iVar7 = 0;
    pline("This %s has no %s.",pcVar10,pcVar11);
  }
  return iVar7;
}

Assistant:

int doread(struct obj *scroll)
{
	boolean confused, known;

	known = FALSE;
	if (check_capacity(NULL)) return 0;
	
	if (scroll && !validate_object(scroll, readable, "read"))
	    return 0;
	else if (!scroll)
	    scroll = getobj(readable, "read", NULL);
	if (!scroll) return 0;

	/* outrumor has its own blindness check */
	if (scroll->otyp == FORTUNE_COOKIE) {
	    if (flags.verbose)
		pline("You break up the cookie and throw away the pieces.");
	    if (u.roleplay.illiterate) {
		pline("The cookie had a scrap of paper inside.");
		pline("What a pity that you cannot read!");
	    } else {
		outrumor(bcsign(scroll), BY_COOKIE);
		if (!Blind) violated(CONDUCT_ILLITERACY);
	    }
	    useup(scroll);
	    return 1;
	} else if (scroll->otyp == T_SHIRT) {
	    static const char *const shirt_msgs[] = { /* Scott Bigham */
    "I explored the Dungeons of Doom and all I got was this lousy T-shirt!",
    "Is that Mjollnir in your pocket or are you just happy to see me?",
    "It's not the size of your sword, it's how #enhance'd you are with it.",
    "Madame Elvira's House O' Succubi Lifetime Customer",
    "Madame Elvira's House O' Succubi Employee of the Month",
    "Ludios Vault Guards Do It In Small, Dark Rooms",
    "Yendor Military Soldiers Do It In Large Groups",
    "I survived Yendor Military Boot Camp",
    "Ludios Accounting School Intra-Mural Lacrosse Team",
    "Oracle(TM) Fountains 10th Annual Wet T-Shirt Contest",
    "Hey, black dragon!  Disintegrate THIS!",
    "I'm With Stupid -->",
    "Don't blame me, I voted for Izchak!",
    "Frodo Lives!",
    "Actually, I AM a quantum mechanic.",
    "I beat the Sword Master",			/* Monkey Island */
    "Don't Panic",				/* HHGTTG */
    "Furinkan High School Athletic Dept.",	/* Ranma 1/2 */
    "Hel-LOOO, Nurse!",			/* Animaniacs */
    /* NAO */
    "=^.^=",
    "100% goblin hair - do not wash",
    "Aim >>> <<< here",
    "cK -- Cockatrice touches the Kop",
    "Don't ask me, I only adventure here",
    "Down With Pants!",
    "Gehennoms Angels",
    "Glutton For Punishment",
    "Go Team Ant!",
    "Got Newt?",
    "Heading for Godhead",
    "Hello, my darlings!", /* Charlie Drake */
    "Hey! Nymphs! Steal This T-Shirt!",
    "I <3 Dungeon of Doom",
    "I am a Valkyrie. If you see me running, try to keep up.",
    "I Am Not a Pack Rat - I Am a Collector",
    "I bounced off a rubber tree",
    "If you can read this, I can hit you with my polearm",
    "I Support Single Succubi",
    "I want to live forever or die in the attempt.",
    "Kop Killaz",
    "Lichen Park",
    "LOST IN THOUGHT - please send search party",
    "Minetown Watch",
    "Ms. Palm's House of Negotiable Affection -- A Very Reputable House Of Disrepute",
    "^^  My eyes are up there!  ^^",
    "Next time you wave at me, use more than one finger, please.",
    "Objects In This Shirt Are Closer Than They Appear",
    "Protection Racketeer",
    "P Happens",
    "Real men love Crom",
    "Sokoban Gym -- Get Strong or Die Trying",
    "Somebody stole my Mojo!",
    "The Hellhound Gang",
    "The Werewolves",
    "They Might Be Storm Giants",
    "Weapons don't kill people, I kill people",
    "White Zombie",
    "Worship me",
    "You laugh because I'm different, I laugh because you're about to die",
    "You should hear what the voices in my head are saying about you.",
    "Anhur State University - Home of the Fighting Fire Ants!",
    "FREE HUGS",
    "Serial Ascender",
    "I couldn't afford this T-shirt so I stole it!",
    "End Mercantile Opacity Discrimination Now: Let Invisible Customers Shop!",
    "Elvira's House O'Succubi, granting the gift of immorality!",
    /* UnNetHack */
    "I made a NetHack fork and all I got was this lousy T-shirt!",	/* galehar */
	    };
	    char buf[BUFSZ];
	    int erosion;

	    if (Blind) {
		pline("You can't feel any Braille writing.");
		return 0;
	    }
	    if (u.roleplay.illiterate) {
		pline("Unfortunately, you cannot read.");
		return 0;
	    } else {
		violated(CONDUCT_ILLITERACY);
		if (flags.verbose)
		    pline("It reads:");
		strcpy(buf, shirt_msgs[scroll->o_id % SIZE(shirt_msgs)]);
	    }
	    erosion = greatest_erosion(scroll);
	    if (erosion)
		wipeout_text(buf,
			(int)(strlen(buf) * erosion / (2*MAX_ERODE)),
			     scroll->o_id ^ (unsigned)u.ubirthday);
	    pline("\"%s\"", buf);
	    return 1;
	} else if (scroll->otyp == CREDIT_CARD) {
	    static const char *card_msgs[] = {
		"Leprechaun Gold Tru$t - Shamrock Card",
		"Magic Memory Vault Charge Card",
		"Larn National Bank", /* Larn */
		"First Bank of Omega", /* Omega */
		"Bank of Zork - Frobozz Magic Card", /* Zork */
		"Ankh-Morpork Merchant's Guild Barter Card",
		"Ankh-Morpork Thieves' Guild Unlimited Transaction Card",
		"Ransmannsby Moneylenders Association",
		"Bank of Gehennom - 99% Interest Card",
		"Yendorian Express - Copper Card",
		"Yendorian Express - Silver Card",
		"Yendorian Express - Gold Card",
		"Yendorian Express - Mithril Card",
		"Yendorian Express - Platinum Card",
	    };
	    if (u.roleplay.illiterate) {
		if (Blind)
		    pline("You feel embossed writing.");
		else if (flags.verbose)
		    pline("There is writing on the %s.", xname(scroll));
		pline("Unfortunately, you cannot read.");
		return 0;
	    }
	    if (Blind) {
		pline("You feel the embossed numbers:");
	    } else {
		if (flags.verbose)
		    pline("It reads:");
		pline("\"%s\"", scroll->oartifact ?
		      card_msgs[SIZE(card_msgs) - 1] :
		      card_msgs[scroll->o_id % (SIZE(card_msgs) - 1)]);
	    }
	    /* Make a credit card number */
	    pline("\"%d0%d %d%d1 0%d%d0\"",
		  (scroll->o_id % 89) + 10, scroll->o_id % 4,
		  ((scroll->o_id * 499) % 899999) + 100000, scroll->o_id % 10,
		  !(scroll->o_id % 3), (scroll->o_id * 7) % 10);
	    violated(CONDUCT_ILLITERACY);
	    return 1;
	} else if (scroll->otyp == TIN ||
		   scroll->otyp == CAN_OF_GREASE ||
		   scroll->otyp == CANDY_BAR) {
	    pline("This %s has no %s.", singular(scroll, xname),
		  scroll->otyp == CANDY_BAR ? "wrapper" : "label");
	    return 0;
	} else if (scroll->otyp == MAGIC_MARKER) {
	    if (Blind) {
		pline("You can't feel any Braille writing.");
		return 0;
	    }
	    if (u.roleplay.illiterate) {
		if (flags.verbose)
		    pline("There is writing on the %s.", xname(scroll));
		pline("Unfortunately, you cannot read.");
		return 0;
	    }
	    if (flags.verbose)
		pline("It reads:");
	    pline("\"Magic Marker(TM) Red Ink Marker Pen. Water Soluble.\"");
	    violated(CONDUCT_ILLITERACY);
	    return 1;
	} else if (scroll->oclass == COIN_CLASS) {
	    char tmp[BUFSZ];
	    if (u.roleplay.illiterate) {
		if (Blind)
		    pline("You feel the embossed words.");
		else if (flags.verbose)
		    pline("There is writing on the %s.", singular(scroll, xname));
		pline("Unfortunately, you cannot read.");
		return 0;
	    }
	    if (Blind)
		pline("You feel the embossed words:");
	    else if (flags.verbose)
		pline("You read:");
	    strcpy(tmp, currency(1));
	    pline("\"1 %s. 857 GUE. In Frobs We Trust.\"", upstart(tmp));
	    violated(CONDUCT_ILLITERACY);
	    return 1;
	} else if (scroll->oartifact == ART_ORB_OF_FATE) {
	    if (u.roleplay.illiterate) {
		if (Blind)
		    pline("You feel an engraved signature.");
		else if (flags.verbose)
		    pline("The %s is signed.", xname(scroll));
		pline("Unfortunately, you cannot read.");
		return 0;
	    }
	    if (Blind)
		pline("You feel the engraved signature:");
	    else
		pline("It is signed:");
	    pline("\"Odin.\"");
	    violated(CONDUCT_ILLITERACY);
	    return 1;
	} else if (OBJ_DESCR(objects[scroll->otyp]) &&
		   !strncmp(OBJ_DESCR(objects[scroll->otyp]), "runed", 5)) {
	    if (scroll->otyp == RUNESWORD) {
		pline("You can't decipher the arcane runes.");
		return 0;
	    } else if (!Race_if(PM_ELF) && !Role_if(PM_ARCHEOLOGIST)) {
		pline("You can't decipher the Elvish runes.");
		return 0;
	    }
	    if (u.roleplay.illiterate) {
		if (Blind)
		    pline("You feel engraved runes.");
		else if (flags.verbose)
		    pline("There are runes on the %s.", xname(scroll));
		pline("Unfortunately, you cannot read.");
		return 0;
	    }
	    violated(CONDUCT_ILLITERACY);
	    if (objects[scroll->otyp].oc_merge) {
		if (Blind)
		    pline("You feel the engraved runes:");
		else if (flags.verbose)
		    pline("The runes read:");
		pline("\"Made in Elfheim.\"");
		return 1;
	    } else {
		/* "Avoid any artifact with Runes on it, even if the Runes
		 *  prove only to spell the maker's name." -- Diana Wynne Jones
		 */
		/* Elf name fragments courtesy of ToME */
		static const char *elf_syllable1[] = {
		    "Al", "An",
		    "Bal", "Bel",
		    "Cal", "Cel",
		    "El", "Elr", "Elv", "Eow", "Ear",
		    "F", "Fal", "Fel", "Fin",
		    "G", "Gal", "Gel", "Gl",
		    "Is", "Lan", "Leg", "Lom",
		    "N", "Nal","Nel",
		    "S", "Sal", "Sel",
		    "T", "Tal", "Tel", "Thr", "Tin",
		};
		static const char *elf_syllable2[] = {
		    "a", "adrie", "ara",
		    "e", "ebri", "ele", "ere",
		    "i", "io", "ithra", "ilma", "il-Ga", "ili",
		    "o", "orfi",
		    "u",
		    "y",
		};
		static const char *elf_syllable3[] = {
		    "l", "las", "lad", "ldor", "ldur", "linde", "lith",
		    "mir", "mbor",
		    "n", "nd", "ndel", "ndil", "ndir", "nduil", "ng",
		    "r", "rith", "ril", "riand", "rion",
		    "s",
		    "thien",
		    "viel",
		    "wen", "wyn",
		};
		if (Blind)
		    pline("You feel the engraved signature:");
		else
		    pline("It is signed:");
		pline("\"%s%s%s\"",
		      elf_syllable1[scroll->o_id % SIZE(elf_syllable1)],
		      elf_syllable2[scroll->o_id % SIZE(elf_syllable2)],
		      elf_syllable3[scroll->o_id % SIZE(elf_syllable3)]);
		return 1;
	    }
	} else if (scroll->oclass != SCROLL_CLASS
		&& scroll->oclass != SPBOOK_CLASS) {
	    pline("That is a silly thing to read.");
	    return 0;
	} else if (u.roleplay.illiterate && scroll->otyp != SPE_BOOK_OF_THE_DEAD) {
	    pline("Unfortunately, you cannot read.");
	    return 0;
	} else if (Blind && scroll->otyp != SPE_BOOK_OF_THE_DEAD) {
	    const char *what = 0;
	    if (scroll->oclass == SPBOOK_CLASS)
		what = "mystic runes";
	    else if (!scroll->dknown)
		what = "formula on the scroll";
	    if (what) {
		pline("Being blind, you cannot read the %s.", what);
		return 0;
	    }
	}

	/* Actions required to win the game aren't counted towards conduct */
	if (scroll->otyp != SPE_BOOK_OF_THE_DEAD &&
		scroll->otyp != SPE_BLANK_PAPER &&
		scroll->otyp != SCR_BLANK_PAPER)
	    violated(CONDUCT_ILLITERACY);

	confused = (Confusion != 0);
	if (scroll->oclass == SPBOOK_CLASS) {
	    return study_book(scroll);
	}
	scroll->in_use = TRUE;	/* scroll, not spellbook, now being read */
	if (scroll->otyp != SCR_BLANK_PAPER) {
	  if (Blind)
	    pline("As you %s the formula on it, the scroll disappears.",
			is_silent(youmonst.data) ? "cogitate" : "pronounce");
	  else
	    pline("As you read the scroll, it disappears.");
	  if (confused) {
	    if (Hallucination)
		pline("Being so trippy, you screw up...");
	    else
		pline("Being confused, you mis%s the magic words...",
			is_silent(youmonst.data) ? "understand" : "pronounce");
	  }
	}
	if (!seffects(scroll, &known))  {
		if (!objects[scroll->otyp].oc_name_known) {
		    if (known) {
			makeknown(scroll->otyp);
			more_experienced(0, 0, 10);
		    } else if (!objects[scroll->otyp].oc_uname)
			docall(scroll);
		}
		if (scroll->otyp != SCR_BLANK_PAPER)
			useup(scroll);
		else scroll->in_use = FALSE;
	}
	return 1;
}